

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::static_huffman_data_model::init(static_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint max_code_size_00;
  uint table_bits;
  byte *pbVar4;
  uchar *puVar5;
  undefined7 extraout_var;
  unsigned_short *pCodes;
  undefined7 extraout_var_00;
  decoder_tables *pdVar7;
  undefined7 extraout_var_01;
  long in_RCX;
  uint in_EDX;
  uint in_R8D;
  uint local_38;
  uint s;
  uint i;
  uint max_code_size;
  uint min_code_size;
  uint code_size_limit_local;
  uint8 *pCode_sizes_local;
  uint total_syms_local;
  bool encoding_local;
  static_huffman_data_model *this_local;
  ulong uVar6;
  
  this->m_encoding = (bool)((byte)ctx & 1);
  max_code_size_00 = math::minimum<unsigned_int>(in_R8D,0x10);
  vector<unsigned_char>::resize(&this->m_code_sizes,in_EDX,false);
  i = 0xffffffff;
  s = 0;
  for (local_38 = 0; uVar6 = (ulong)local_38, local_38 < in_EDX; local_38 = local_38 + 1) {
    bVar1 = *(byte *)(in_RCX + (ulong)local_38);
    pbVar4 = vector<unsigned_char>::operator[](&this->m_code_sizes,local_38);
    *pbVar4 = bVar1;
    i = math::minimum<unsigned_int>(i,(uint)bVar1);
    s = math::maximum<unsigned_int>(s,(uint)bVar1);
  }
  if (((s == 0) || (0x20 < s)) || (uVar6 = (ulong)i, max_code_size_00 < i)) {
    this_local._7_1_ = 0;
  }
  else {
    if (max_code_size_00 < s) {
      uVar2 = this->m_total_syms;
      puVar5 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      bVar3 = prefix_coding::limit_max_code_size(uVar2,puVar5,max_code_size_00);
      uVar6 = CONCAT71(extraout_var,bVar3);
      if (!bVar3) {
        this_local._7_1_ = 0;
        goto LAB_0021289a;
      }
    }
    if ((this->m_encoding & 1U) == 0) {
      vector<unsigned_short>::clear(&this->m_codes);
      if (this->m_pDecode_tables == (decoder_tables *)0x0) {
        pdVar7 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
        this->m_pDecode_tables = pdVar7;
      }
      uVar2 = this->m_total_syms;
      puVar5 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      pdVar7 = this->m_pDecode_tables;
      table_bits = compute_decoder_table_bits(this);
      bVar3 = prefix_coding::generate_decoder_tables(uVar2,puVar5,pdVar7,table_bits);
      uVar6 = CONCAT71(extraout_var_01,bVar3);
      if (!bVar3) {
        this_local._7_1_ = 0;
        goto LAB_0021289a;
      }
    }
    else {
      vector<unsigned_short>::resize(&this->m_codes,in_EDX,false);
      if (this->m_pDecode_tables != (decoder_tables *)0x0) {
        crnlib_delete<crnlib::prefix_coding::decoder_tables>(this->m_pDecode_tables);
        this->m_pDecode_tables = (decoder_tables *)0x0;
      }
      uVar2 = this->m_total_syms;
      puVar5 = vector<unsigned_char>::operator[](&this->m_code_sizes,0);
      pCodes = vector<unsigned_short>::operator[](&this->m_codes,0);
      bVar3 = prefix_coding::generate_codes(uVar2,puVar5,pCodes);
      uVar6 = CONCAT71(extraout_var_00,bVar3);
      if (!bVar3) {
        this_local._7_1_ = 0;
        goto LAB_0021289a;
      }
    }
    this_local._7_1_ = 1;
  }
LAB_0021289a:
  return (int)CONCAT71((int7)(uVar6 >> 8),this_local._7_1_);
}

Assistant:

bool static_huffman_data_model::init(bool encoding, uint total_syms, const uint8* pCode_sizes, uint code_size_limit)
    {
        CRNLIB_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms) && (code_size_limit >= 1));

        m_encoding = encoding;

        code_size_limit = math::minimum(code_size_limit, prefix_coding::cMaxExpectedCodeSize);

        m_code_sizes.resize(total_syms);

        uint min_code_size = UINT_MAX;
        uint max_code_size = 0;

        for (uint i = 0; i < total_syms; i++)
        {
            uint s = pCode_sizes[i];
            m_code_sizes[i] = static_cast<uint8>(s);
            min_code_size = math::minimum(min_code_size, s);
            max_code_size = math::maximum(max_code_size, s);
        }

        if ((max_code_size < 1) || (max_code_size > 32) || (min_code_size > code_size_limit))
        {
            return false;
        }

        if (max_code_size > code_size_limit)
        {
            if (!prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], code_size_limit))
            {
                return false;
            }
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);

            if (m_pDecode_tables)
            {
                crnlib_delete(m_pDecode_tables);
                m_pDecode_tables = nullptr;
            }

            if (!prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]))
            {
                return false;
            }
        }
        else
        {
            m_codes.clear();

            if (!m_pDecode_tables)
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
            }

            if (!prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, compute_decoder_table_bits()))
            {
                return false;
            }
        }

        return true;
    }